

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void WrapLine(TidyDocImpl *doc)

{
  uint *puVar1;
  int iVar2;
  Bool BVar3;
  ulong uVar4;
  
  if ((doc->pprint).wraphere != 0) {
    BVar3 = WantIndent(doc);
    if (BVar3 != no) {
      WriteIndentChar(doc);
    }
    if ((doc->pprint).wraphere != 0) {
      uVar4 = 0;
      do {
        prvTidyWriteChar((doc->pprint).linebuf[uVar4],doc->docOut);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (doc->pprint).wraphere);
    }
    iVar2 = (doc->pprint).indent[0].attrStringStart;
    if ((iVar2 == 0) || ((0 < iVar2 && (iVar2 < (int)(doc->pprint).wraphere)))) {
      prvTidyWriteChar(0x5c,doc->docOut);
    }
    prvTidyWriteChar(10,doc->docOut);
    puVar1 = &(doc->pprint).line;
    *puVar1 = *puVar1 + 1;
    ResetLineAfterWrap(&doc->pprint);
    return;
  }
  return;
}

Assistant:

static void WrapLine( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;

    if ( pprint->wraphere == 0 )
        return;

    if ( WantIndent(doc) )
        WriteIndentChar(doc);

    for ( i = 0; i < pprint->wraphere; ++i )
        TY_(WriteChar)( pprint->linebuf[i], doc->docOut );

    if ( IsWrapInString(pprint) )
        TY_(WriteChar)( '\\', doc->docOut );

    TY_(WriteChar)( '\n', doc->docOut );
    pprint->line++;
    ResetLineAfterWrap( pprint );
}